

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
__thiscall wabt::MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&>(wabt *this,Location *args)

{
  ElemSegmentModuleField *this_00;
  
  this_00 = (ElemSegmentModuleField *)operator_new(0xe8);
  ElemSegmentModuleField::ElemSegmentModuleField(this_00,args,(string_view)ZEXT816(0));
  *(ElemSegmentModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}